

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

table_format_info * __thiscall
toml::basic_value<toml::type_config>::as_table_fmt(basic_value<toml::type_config> *this)

{
  char *in_RDI;
  value_t in_stack_000000c7;
  string *in_stack_000000c8;
  basic_value<toml::type_config> *in_stack_000000d0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (*in_RDI != '\n') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    throw_bad_cast(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7);
  }
  return (table_format_info *)(in_RDI + 0x10);
}

Assistant:

table_format_info& as_table_fmt()
    {
        if(this->type_ != value_t::table)
        {
            this->throw_bad_cast("toml::value::as_table_fmt()", value_t::table);
        }
        return this->table_.format;
    }